

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder.cpp
# Opt level: O0

Action __thiscall
psy::C::DeclarationBinder::visitCompoundStatement
          (DeclarationBinder *this,CompoundStatementSyntax *node)

{
  Action AVar1;
  CoreSyntaxNodeList<psy::C::StatementSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::StatementSyntax_*>_>
  *it;
  CompoundStatementSyntax *node_local;
  DeclarationBinder *this_local;
  
  pushNewScope(this,(SyntaxNode *)node,Block,true);
  it = &CompoundStatementSyntax::statements(node)->
        super_CoreSyntaxNodeList<psy::C::StatementSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::StatementSyntax_*>_>
  ;
  AVar1 = SyntaxVisitor::
          visit<psy::C::StatementSyntax*,psy::C::SyntaxNodePlainList<psy::C::StatementSyntax*>>
                    (&this->super_SyntaxVisitor,it);
  if (AVar1 == Quit) {
    this_local._7_1_ = Quit;
  }
  else {
    popScope(this);
    this_local._7_1_ = Skip;
  }
  return this_local._7_1_;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitCompoundStatement(const CompoundStatementSyntax* node)
{
    pushNewScope(node, ScopeKind::Block, true);
    VISIT(node->statements());
    popScope();

    return Action::Skip;
}